

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

void __thiscall crnlib::dxt3_block::set_alpha(dxt3_block *this,uint x,uint y,uint value,bool scaled)

{
  uint uVar1;
  uint c;
  uint ofs;
  bool scaled_local;
  uint value_local;
  uint y_local;
  uint x_local;
  dxt3_block *this_local;
  
  ofs = value;
  if (scaled) {
    ofs = (value * 0xf + 0x80) / 0xff;
  }
  uVar1 = y * 2 + (x >> 1);
  this->m_alpha[uVar1] =
       (byte)(ofs << (sbyte)((x & 1) << 2)) |
       ((byte)(0xf << (sbyte)((x & 1) << 2)) ^ 0xff) & this->m_alpha[uVar1];
  return;
}

Assistant:

void dxt3_block::set_alpha(uint x, uint y, uint value, bool scaled)
    {
        CRNLIB_ASSERT((x < cDXTBlockSize) && (y < cDXTBlockSize));

        if (scaled)
        {
            CRNLIB_ASSERT(value <= 0xFF);
            value = (value * 15U + 128U) / 255U;
        }
        else
        {
            CRNLIB_ASSERT(value <= 0xF);
        }

        uint ofs = (y << 1U) + (x >> 1U);
        uint c = m_alpha[ofs];

        c &= ~(0xF << ((x & 1U) << 2U));
        c |= (value << ((x & 1U) << 2U));

        m_alpha[ofs] = static_cast<uint8>(c);
    }